

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::mark_scalar_layout_structs(CompilerMSL *this,SPIRType *type)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t value;
  uint32_t uVar8;
  SPIRType *type_00;
  SPIRType *struct_type;
  CompilerError *this_00;
  ulong uVar9;
  uint32_t dim;
  uint32_t uVar10;
  ulong uVar11;
  
  uVar11 = (ulong)(uint)(type->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
  uVar9 = 0;
  do {
    if (uVar9 == uVar11) {
      return;
    }
    type_00 = Compiler::get<spirv_cross::SPIRType>
                        ((Compiler *)this,
                         (type->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar9].
                         id);
    if ((type_00->basetype == Struct) &&
       ((struct_type = type_00, type_00->pointer != true ||
        (type_00->storage != PhysicalStorageBuffer)))) {
      while ((struct_type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
        struct_type = Compiler::get<spirv_cross::SPIRType>
                                ((Compiler *)this,(struct_type->parent_type).id);
      }
      bVar3 = Compiler::has_extended_decoration
                        ((Compiler *)this,(struct_type->super_IVariant).self.id,
                         SPIRVCrossDecorationPhysicalTypePacked);
      if (!bVar3) {
        uVar10 = (uint32_t)uVar9;
        uVar4 = get_declared_struct_member_alignment_msl(this,type,uVar10);
        uVar5 = get_declared_struct_member_size_msl(this,type,uVar10);
        uVar6 = Compiler::type_struct_member_offset((Compiler *)this,type,uVar10);
        if (uVar9 + 1 < uVar11) {
          uVar7 = Compiler::type_struct_member_offset((Compiler *)this,type,(uint32_t)(uVar9 + 1));
        }
        else {
          uVar7 = uVar5 + uVar6;
        }
        value = 0;
        bVar3 = uVar7 < uVar5 + uVar6;
        sVar1 = (type_00->array).super_VectorView<unsigned_int>.buffer_size;
        if (sVar1 != 0) {
          value = Compiler::type_struct_member_array_stride((Compiler *)this,type,uVar10);
          sVar2 = (type_00->array).super_VectorView<unsigned_int>.buffer_size;
          for (uVar10 = 0; (int)sVar2 - 1U != uVar10; uVar10 = uVar10 + 1) {
            uVar8 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,type_00,uVar10);
            value = value / (uVar8 + (uVar8 == 0));
          }
          uVar10 = get_declared_struct_size_msl(this,struct_type,false,false);
          bVar3 = value < uVar10 || uVar7 < uVar5 + uVar6;
        }
        if ((uVar6 % uVar4 != 0) || (bVar3)) {
          mark_struct_members_packed(this,struct_type);
        }
        mark_scalar_layout_structs(this,struct_type);
        if (sVar1 != 0) {
          uVar4 = get_declared_struct_size_msl(this,struct_type,true,true);
          if (value < uVar4) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (this_00,"Cannot express an array stride smaller than size of struct type.");
LAB_001fd398:
            __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar3 = Compiler::has_extended_decoration
                            ((Compiler *)this,(struct_type->super_IVariant).self.id,
                             SPIRVCrossDecorationPaddingTarget);
          uVar4 = (struct_type->super_IVariant).self.id;
          if (bVar3) {
            uVar4 = Compiler::get_extended_decoration
                              ((Compiler *)this,uVar4,SPIRVCrossDecorationPaddingTarget);
            if (value != uVar4) {
              this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (this_00,
                         "A struct is used with different array strides. Cannot express this in MSL."
                        );
              goto LAB_001fd398;
            }
          }
          else {
            Compiler::set_extended_decoration
                      ((Compiler *)this,uVar4,SPIRVCrossDecorationPaddingTarget,value);
          }
        }
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void CompilerMSL::mark_scalar_layout_structs(const SPIRType &type)
{
	uint32_t mbr_cnt = uint32_t(type.member_types.size());
	for (uint32_t i = 0; i < mbr_cnt; i++)
	{
		// Handle possible recursion when a struct contains a pointer to its own type nested somewhere.
		auto &mbr_type = get<SPIRType>(type.member_types[i]);
		if (mbr_type.basetype == SPIRType::Struct && !(mbr_type.pointer && mbr_type.storage == StorageClassPhysicalStorageBuffer))
		{
			auto *struct_type = &mbr_type;
			while (!struct_type->array.empty())
				struct_type = &get<SPIRType>(struct_type->parent_type);

			if (has_extended_decoration(struct_type->self, SPIRVCrossDecorationPhysicalTypePacked))
				continue;

			uint32_t msl_alignment = get_declared_struct_member_alignment_msl(type, i);
			uint32_t msl_size = get_declared_struct_member_size_msl(type, i);
			uint32_t spirv_offset = type_struct_member_offset(type, i);
			uint32_t spirv_offset_next;
			if (i + 1 < mbr_cnt)
				spirv_offset_next = type_struct_member_offset(type, i + 1);
			else
				spirv_offset_next = spirv_offset + msl_size;

			// Both are complicated cases. In scalar layout, a struct of float3 might just consume 12 bytes,
			// and the next member will be placed at offset 12.
			bool struct_is_misaligned = (spirv_offset % msl_alignment) != 0;
			bool struct_is_too_large = spirv_offset + msl_size > spirv_offset_next;
			uint32_t array_stride = 0;
			bool struct_needs_explicit_padding = false;

			// Verify that if a struct is used as an array that ArrayStride matches the effective size of the struct.
			if (!mbr_type.array.empty())
			{
				array_stride = type_struct_member_array_stride(type, i);
				uint32_t dimensions = uint32_t(mbr_type.array.size() - 1);
				for (uint32_t dim = 0; dim < dimensions; dim++)
				{
					uint32_t array_size = to_array_size_literal(mbr_type, dim);
					array_stride /= max<uint32_t>(array_size, 1u);
				}

				// Set expected struct size based on ArrayStride.
				struct_needs_explicit_padding = true;

				// If struct size is larger than array stride, we might be able to fit, if we tightly pack.
				if (get_declared_struct_size_msl(*struct_type) > array_stride)
					struct_is_too_large = true;
			}

			if (struct_is_misaligned || struct_is_too_large)
				mark_struct_members_packed(*struct_type);
			mark_scalar_layout_structs(*struct_type);

			if (struct_needs_explicit_padding)
			{
				msl_size = get_declared_struct_size_msl(*struct_type, true, true);
				if (array_stride < msl_size)
				{
					SPIRV_CROSS_THROW("Cannot express an array stride smaller than size of struct type.");
				}
				else
				{
					if (has_extended_decoration(struct_type->self, SPIRVCrossDecorationPaddingTarget))
					{
						if (array_stride !=
						    get_extended_decoration(struct_type->self, SPIRVCrossDecorationPaddingTarget))
							SPIRV_CROSS_THROW(
							    "A struct is used with different array strides. Cannot express this in MSL.");
					}
					else
						set_extended_decoration(struct_type->self, SPIRVCrossDecorationPaddingTarget, array_stride);
				}
			}
		}
	}
}